

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

string * __thiscall
deqp::gls::getShaderInfoLog_abi_cxx11_(string *__return_storage_ptr__,gls *this,deUint32 shaderGL)

{
  undefined4 shader;
  size_type sVar1;
  reference pvVar2;
  allocator<char> local_3d [13];
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> infoLog;
  int infoLogLen;
  deUint32 shaderGL_local;
  
  infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = SUB84(this,0);
  infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_30);
  glwGetShaderiv(infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x8b84,
                 (GLint *)&infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           field_0x10);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_30,
             (long)(infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1));
  shader = infoLog.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
  sVar1 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)local_30);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,0);
  glwGetShaderInfoLog(shader,(GLsizei)sVar1,(GLsizei *)0x0,pvVar2);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_30,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pvVar2,local_3d);
  std::allocator<char>::~allocator(local_3d);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

static inline string getShaderInfoLog (const deUint32 shaderGL)
{
	int				infoLogLen = 0;
	vector<char>	infoLog;
	glGetShaderiv(shaderGL, GL_INFO_LOG_LENGTH, &infoLogLen);
	infoLog.resize(infoLogLen+1);
	glGetShaderInfoLog(shaderGL, (int)infoLog.size(), DE_NULL, &infoLog[0]);
	return &infoLog[0];
}